

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

Handle __thiscall soul::Value::getStringLiteral(Value *this)

{
  Handle HVar1;
  PackedData local_20;
  
  getData(&local_20,this);
  HVar1 = PackedData::getAs<choc::value::StringDictionary::Handle>(&local_20);
  return (Handle)HVar1.handle;
}

Assistant:

StringDictionary::Handle Value::getStringLiteral() const    { return getData().getAs<StringDictionary::Handle>(); }